

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O0

iterator * __thiscall QTextBlock::end(QTextBlock *this)

{
  uint begin;
  uint end;
  long *in_RSI;
  iterator *in_RDI;
  int e;
  int b;
  int len;
  int pos;
  uint in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  iterator *piVar1;
  
  if ((*in_RSI == 0) || ((int)in_RSI[1] == 0)) {
    piVar1 = in_RDI;
    memset(in_RDI,0,0x18);
    iterator::iterator(piVar1);
  }
  else {
    piVar1 = in_RDI;
    position((QTextBlock *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    length((QTextBlock *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    QTextDocumentPrivate::fragmentMap((QTextDocumentPrivate *)*in_RSI);
    begin = QFragmentMap<QTextFragmentData>::findNode
                      ((QFragmentMap<QTextFragmentData> *)piVar1,in_stack_ffffffffffffffcc,
                       in_stack_ffffffffffffffc8);
    QTextDocumentPrivate::fragmentMap((QTextDocumentPrivate *)*in_RSI);
    end = QFragmentMap<QTextFragmentData>::findNode
                    ((QFragmentMap<QTextFragmentData> *)piVar1,in_stack_ffffffffffffffcc,
                     in_stack_ffffffffffffffc8);
    iterator::iterator(piVar1,(QTextDocumentPrivate *)*in_RSI,begin,end,end);
  }
  return in_RDI;
}

Assistant:

QTextBlock::iterator QTextBlock::end() const
{
    if (!p || !n)
        return iterator();

    int pos = position();
    int len = length() - 1; // exclude the fragment that holds the paragraph separator
    int b = p->fragmentMap().findNode(pos);
    int e = p->fragmentMap().findNode(pos+len);
    return iterator(p, b, e, e);
}